

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O3

void __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::setIdentity
          (PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this,Index newSize)

{
  long lVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this,(long)newSize);
  auVar2 = _DAT_00133420;
  uVar3 = (uint)*(undefined8 *)(this + 8);
  if (0 < (int)uVar3) {
    lVar1 = *(long *)this;
    lVar4 = (ulong)(uVar3 & 0x7fffffff) - 1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_00133420;
    auVar7 = _DAT_00133410;
    do {
      auVar8 = auVar7 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        *(int *)(lVar1 + uVar5 * 4) = (int)uVar5;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        *(int *)(lVar1 + 4 + uVar5 * 4) = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar4 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar4 + 2;
    } while ((uVar3 + 1 & 0xfffffffe) != uVar5);
  }
  return;
}

Assistant:

void setIdentity(Index newSize)
    {
      resize(newSize);
      setIdentity();
    }